

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

ClockingSkew __thiscall
slang::ast::ClockingBlockSymbol::getDefaultInputSkew(ClockingBlockSymbol *this)

{
  Scope *scope;
  LookupLocation LVar1;
  ClockingSkew CVar2;
  LookupLocation lookupLocation;
  ASTContext context;
  ASTContext local_50;
  ASTContext *context_00;
  
  if ((this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged == true) {
    CVar2._4_4_ = 0;
    CVar2.edge = (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>
                 ._M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload.
                 _M_value.edge;
    CVar2.delay = (this->defaultInputSkew).
                  super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay;
  }
  else if (this->inputSkewSyntax == (ClockingSkewSyntax *)0x0) {
    *(undefined8 *)
     &(this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload = 0;
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay =
         (TimingControl *)0x0;
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged = true;
    CVar2 = (ClockingSkew)ZEXT816(0);
  }
  else {
    scope = (this->super_Symbol).parentScope;
    if (scope == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x4ee,"ClockingSkew slang::ast::ClockingBlockSymbol::getDefaultInputSkew() const")
      ;
    }
    LVar1 = LookupLocation::before(&this->super_Symbol);
    lookupLocation._8_8_ = LVar1._8_8_ & 0xffffffff;
    lookupLocation.scope = LVar1.scope;
    ASTContext::ASTContext(&local_50,scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x0);
    CVar2 = ClockingSkew::fromSyntax
                      ((ClockingSkew *)this->inputSkewSyntax,(ClockingSkewSyntax *)&local_50,
                       context_00);
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.edge = CVar2.edge;
    (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ast::ClockingSkew>._M_payload._M_value.delay = CVar2.delay;
    if ((this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged == false) {
      (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged = true;
    }
  }
  return CVar2;
}

Assistant:

ClockingSkew ClockingBlockSymbol::getDefaultInputSkew() const {
    if (!defaultInputSkew) {
        if (inputSkewSyntax) {
            auto scope = getParentScope();
            ASSERT(scope);

            ASTContext context(*scope, LookupLocation::before(*this));
            defaultInputSkew = ClockingSkew::fromSyntax(*inputSkewSyntax, context);
        }
        else {
            defaultInputSkew.emplace();
        }
    }
    return *defaultInputSkew;
}